

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O1

bool deqp::egl::compareCorners(Surface *oldSurface,Surface *newSurface)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int width;
  int height;
  int y;
  int x;
  int y_00;
  bool bVar5;
  int iVar6;
  int x_00;
  void *pvVar7;
  int iVar8;
  bool bVar9;
  ConstPixelBufferAccess newAccess;
  ConstPixelBufferAccess oldAccess;
  ConstPixelBufferAccess local_a8;
  ConstPixelBufferAccess local_80;
  ConstPixelBufferAccess local_58;
  
  iVar1 = oldSurface->m_width;
  iVar2 = oldSurface->m_height;
  iVar3 = newSurface->m_width;
  iVar4 = newSurface->m_height;
  width = iVar3;
  if (iVar1 < iVar3) {
    width = iVar1;
  }
  height = iVar4;
  if (iVar2 < iVar4) {
    height = iVar2;
  }
  bVar9 = true;
  iVar6 = 0;
  do {
    x_00 = iVar3 - width;
    x = iVar1 - width;
    if (iVar6 == 0) {
      x_00 = 0;
      x = 0;
    }
    iVar8 = 1;
    do {
      y = iVar4 - height;
      y_00 = iVar2 - height;
      if (iVar8 == 1) {
        y = 0;
        y_00 = 0;
      }
      local_80.m_format.order = RGBA;
      local_80.m_format.type = UNORM_INT8;
      pvVar7 = (void *)(oldSurface->m_pixels).m_cap;
      if (pvVar7 != (void *)0x0) {
        pvVar7 = (oldSurface->m_pixels).m_ptr;
      }
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                (&local_a8,&local_80.m_format,oldSurface->m_width,oldSurface->m_height,1,pvVar7);
      tcu::getSubregion(&local_80,&local_a8,x,y_00,width,height);
      local_a8.m_format.order = RGBA;
      local_a8.m_format.type = UNORM_INT8;
      pvVar7 = (void *)(newSurface->m_pixels).m_cap;
      if (pvVar7 != (void *)0x0) {
        pvVar7 = (newSurface->m_pixels).m_ptr;
      }
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                (&local_58,&local_a8.m_format,newSurface->m_width,newSurface->m_height,1,pvVar7);
      tcu::getSubregion(&local_a8,&local_58,x_00,y,width,height);
      bVar5 = compareRectangles(&local_80,&local_a8);
      if (bVar5) {
        return bVar9;
      }
      iVar8 = iVar8 + -1;
    } while (iVar8 == 0);
    bVar9 = iVar6 == 0;
    iVar6 = iVar6 + 1;
    if (!bVar9) {
      return bVar9;
    }
  } while( true );
}

Assistant:

bool compareCorners (const Surface& oldSurface, const Surface& newSurface)
{
	const int	oldWidth	= oldSurface.getWidth();
	const int	oldHeight	= oldSurface.getHeight();
	const int	newWidth	= newSurface.getWidth();
	const int	newHeight	= newSurface.getHeight();
	const int	minWidth	= de::min(oldWidth, newWidth);
	const int	minHeight	= de::min(oldHeight, newHeight);

	for (int xCorner = 0; xCorner < 2; ++xCorner)
	{
		const int oldX = xCorner == 0 ? 0 : oldWidth - minWidth;
		const int newX = xCorner == 0 ? 0 : newWidth - minWidth;

		for (int yCorner = 0; yCorner < 2; ++yCorner)
		{
			const int				oldY		= yCorner == 0 ? 0 : oldHeight - minHeight;
			const int				newY		= yCorner == 0 ? 0 : newHeight - minHeight;
			ConstPixelBufferAccess	oldAccess	=
				getSubregion(oldSurface.getAccess(), oldX, oldY, minWidth, minHeight);
			ConstPixelBufferAccess	newAccess	=
				getSubregion(newSurface.getAccess(), newX, newY, minWidth, minHeight);

			if (compareRectangles(oldAccess, newAccess))
				return true;
		}
	}

	return false;
}